

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall Equality_modelEqual_Test::Equality_modelEqual_Test(Equality_modelEqual_Test *this)

{
  Equality_modelEqual_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_modelEqual_Test_0014a770;
  return;
}

Assistant:

TEST(Equality, modelEqual)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();
    libcellml::ModelPtr m2 = libcellml::Model::create();

    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    m1->addComponent(c1);
    m2->addComponent(c2);

    m1->addUnits(u1);
    m2->addUnits(u2);

    EXPECT_TRUE(m1->equals(m2));
    EXPECT_TRUE(m2->equals(m1));
}